

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3OpenTableAndIndices(Parse *pParse,Table *pTab,int baseCur,int op)

{
  uint uVar1;
  Index *pIdx;
  int addr;
  Vdbe *p;
  KeyInfo *zP4;
  Schema **ppSVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if ((pTab->tabFlags & 0x10) == 0) {
    if (pTab->pSchema == (Schema *)0x0) {
      uVar4 = 0xfff0bdc0;
    }
    else {
      uVar1 = pParse->db->nDb;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      else {
        ppSVar2 = &pParse->db->aDb->pSchema;
        uVar4 = 0;
        do {
          if (*ppSVar2 == pTab->pSchema) goto LAB_00199be7;
          uVar4 = uVar4 + 1;
          ppSVar2 = ppSVar2 + 4;
        } while (uVar1 != uVar4);
        uVar4 = (ulong)uVar1;
      }
    }
LAB_00199be7:
    p = sqlite3GetVdbe(pParse);
    sqlite3OpenTable(pParse,baseCur,(int)uVar4,pTab,op);
    iVar3 = 1;
    for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
      zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
      addr = sqlite3VdbeAddOp3(p,op,baseCur + iVar3,pIdx->tnum,(int)uVar4);
      sqlite3VdbeChangeP4(p,addr,(char *)zP4,-0x10);
      iVar3 = iVar3 + 1;
    }
    if (pParse->nTab < baseCur + iVar3) {
      pParse->nTab = baseCur + iVar3;
    }
    iVar3 = iVar3 + -1;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int baseCur,     /* Cursor number assigned to the table */
  int op           /* OP_OpenRead or OP_OpenWrite */
){
  int i;
  int iDb;
  Index *pIdx;
  Vdbe *v;

  if( IsVirtual(pTab) ) return 0;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3OpenTable(pParse, baseCur, iDb, pTab, op);
  for(i=1, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
    assert( pIdx->pSchema==pTab->pSchema );
    sqlite3VdbeAddOp4(v, op, i+baseCur, pIdx->tnum, iDb,
                      (char*)pKey, P4_KEYINFO_HANDOFF);
    VdbeComment((v, "%s", pIdx->zName));
  }
  if( pParse->nTab<baseCur+i ){
    pParse->nTab = baseCur+i;
  }
  return i-1;
}